

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

command_node * __thiscall
libchars::command_node::add(command_node *this,string *word,filter_t mask_,bool hidden_)

{
  ulong uVar1;
  size_type sVar2;
  pointer pcVar3;
  double dVar4;
  string *psVar5;
  debug *pdVar6;
  command *pcVar7;
  command_node *pcVar8;
  command_node *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined8 uVar11;
  undefined7 in_register_00000009;
  undefined1 *puVar12;
  ulong uVar13;
  command_node *pcVar14;
  undefined1 *puVar15;
  command *parent;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 local_98 [32];
  command *local_78;
  string *local_70;
  command *local_68;
  command_node *local_60;
  _Alloc_hider local_58;
  string part;
  
  pdVar6 = debug::initialize(0);
  uVar16 = (undefined4)CONCAT71(in_register_00000009,hidden_);
  debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  this->mask = this->mask | mask_;
  pcVar7 = (command *)this->head;
  if (pcVar7 == (command *)0x0) {
    pcVar8 = (command_node *)debug::initialize(0);
    debug::log((debug *)pcVar8,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    pcVar8 = add_node(pcVar8,this,word,mask_,hidden_);
    return pcVar8;
  }
  local_78 = (command *)this;
  local_70 = word;
  local_60 = (command_node *)mask_;
  part.field_2._12_4_ = uVar16;
  if (word->_M_string_length == 0) {
    local_68 = (command *)0x0;
    puVar15 = (undefined1 *)0x0;
    pcVar8 = (command_node *)0x0;
  }
  else {
    puVar15 = (undefined1 *)0x0;
    local_68 = (command *)0x0;
    parent = pcVar7;
    pcVar9 = (command_node *)0x0;
    pcVar14 = (command_node *)0x0;
    do {
      pcVar8 = pcVar9;
      pdVar6 = debug::initialize(0);
      dVar4 = debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      pcVar9 = local_60;
      puVar12 = (undefined1 *)local_70->_M_string_length;
      if (puVar12 <= puVar15) {
LAB_0010aa47:
        uVar11 = std::__throw_out_of_range_fmt
                           ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                            SUB84(dVar4,0),puVar15,puVar12);
        if (local_98._0_8_ != mask_) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
        if ((size_type *)local_58._M_p != &part._M_string_length) {
          operator_delete(local_58._M_p,part._M_string_length + 1);
        }
        _Unwind_Resume(uVar11);
      }
      uVar1 = (parent->name)._M_string_length;
      uVar13 = (long)pcVar8 - (long)pcVar14;
      pcVar7 = parent;
      mask_ = (filter_t)pcVar8;
      if (uVar13 == 0) {
        if (uVar1 == 0) {
          puVar15 = (undefined1 *)0x0;
          puVar12 = (undefined1 *)0x0;
          mask_ = 0;
          goto LAB_0010aa47;
        }
        if (*(parent->name)._M_dataplus._M_p == puVar15[(long)(local_70->_M_dataplus)._M_p]) {
          puVar15 = puVar15 + 1;
          mask_ = (filter_t)((long)&(pcVar8->part)._M_dataplus._M_p + 1);
          parent = local_68;
        }
        else {
          pcVar7 = (command *)(parent->help)._M_dataplus._M_p;
          if (pcVar7 == (command *)0x0) {
            pcVar8 = (command_node *)&local_58;
            std::__cxx11::string::substr((ulong)&local_58,(ulong)local_70);
            pcVar7 = (command *)
                     add_node(pcVar8,(command_node *)local_78,(string *)&local_58,(filter_t)local_60
                              ,(bool)part.field_2._M_local_buf[0xc]);
            goto LAB_0010a6da;
          }
        }
      }
      else if (uVar13 < uVar1) {
        if ((parent->name)._M_dataplus._M_p[uVar13] != puVar15[(long)(local_70->_M_dataplus)._M_p])
        {
          pdVar6 = debug::initialize(0);
          dVar4 = debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
          local_58._M_p = (pointer)&part._M_string_length;
          pcVar3 = (parent->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    (SUB84(dVar4,0),&local_58,pcVar3,pcVar3 + (parent->name)._M_string_length);
          pcVar9 = (command_node *)operator_new(0x58);
          pcVar8 = local_60;
          command_node(pcVar9);
          std::__cxx11::string::assign((string *)pcVar9,(ulong)&local_58,0);
          pcVar9->mask = *(ulong *)&parent->ID | (ulong)pcVar8;
          pcVar9->next = (command_node *)(parent->help)._M_dataplus._M_p;
          std::__cxx11::string::substr((ulong)local_98,(ulong)&local_58);
          std::__cxx11::string::operator=((string *)parent,(string *)local_98);
          pcVar8 = (command_node *)local_98._0_8_;
          if ((command_node *)local_98._0_8_ != (command_node *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
          (parent->help)._M_dataplus._M_p = (pointer)0x0;
          add_node(pcVar8,pcVar9,(command_node *)parent);
          pcVar8 = local_60;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&local_68->help;
          if (local_68 == (command *)0x0) {
            paVar10 = &(local_78->cmd_str).field_2;
          }
          *(command_node **)paVar10 = pcVar9;
          if (pcVar9->next == (command_node *)0x0) {
            *(command_node **)((long)&(local_78->cmd_str).field_2 + 8) = pcVar9;
          }
          pcVar14 = (command_node *)local_98;
          std::__cxx11::string::substr((ulong)pcVar14,(ulong)local_70);
          pcVar7 = (command *)
                   add_node(pcVar14,pcVar9,(string *)local_98,(filter_t)pcVar8,
                            (bool)part.field_2._M_local_buf[0xc]);
          if ((command_node *)local_98._0_8_ != (command_node *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
          goto LAB_0010a6da;
        }
        puVar15 = puVar15 + 1;
        mask_ = (filter_t)((long)&(pcVar8->part)._M_dataplus._M_p + 1);
        pcVar8 = pcVar14;
        parent = local_68;
      }
      else {
        pcVar7 = *(command **)&(parent->cmd_str).field_2;
        *(ulong *)&parent->ID = *(ulong *)&parent->ID | (ulong)local_60;
        if (pcVar7 == (command *)0x0) {
          pcVar8 = (command_node *)&local_58;
          std::__cxx11::string::substr((ulong)&local_58,(ulong)local_70);
          pcVar7 = (command *)
                   add_node(pcVar8,(command_node *)parent,(string *)&local_58,(filter_t)pcVar9,
                            (bool)part.field_2._M_local_buf[0xc]);
          goto LAB_0010a6da;
        }
        local_68 = (command *)0x0;
        local_78 = parent;
        parent = local_68;
      }
      local_68 = parent;
      parent = pcVar7;
      pcVar9 = (command_node *)mask_;
      pcVar14 = pcVar8;
    } while (puVar15 < puVar12);
  }
  pdVar6 = debug::initialize(0);
  psVar5 = local_70;
  debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
  pdVar6 = debug::initialize(0);
  debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
  pcVar9 = local_60;
  if (puVar15 < (undefined1 *)psVar5->_M_string_length) {
    *(ulong *)&pcVar7->ID = *(ulong *)&pcVar7->ID | (ulong)local_60;
    pcVar8 = (command_node *)&local_58;
    std::__cxx11::string::substr((ulong)&local_58,(ulong)psVar5);
    pcVar7 = (command *)
             add_node(pcVar8,(command_node *)pcVar7,(string *)&local_58,(filter_t)pcVar9,
                      (bool)part.field_2._M_local_buf[0xc]);
LAB_0010a6da:
    if ((size_type *)local_58._M_p != &part._M_string_length) {
      operator_delete(local_58._M_p,part._M_string_length + 1);
    }
  }
  else {
    sVar2 = (pcVar7->name)._M_string_length;
    pdVar6 = debug::initialize(0);
    if (puVar15 < (undefined1 *)((long)&(pcVar8->part)._M_dataplus._M_p + sVar2)) {
      dVar4 = debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      local_58._M_p = (pointer)&part._M_string_length;
      pcVar3 = (pcVar7->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                (SUB84(dVar4,0),&local_58,pcVar3,pcVar3 + (pcVar7->name)._M_string_length);
      std::__cxx11::string::assign((string *)pcVar7,(ulong)&local_58,0);
      pcVar9 = (command_node *)(pcVar7->cmd_str).field_2._M_allocated_capacity;
      pcVar14 = *(command_node **)((long)&(pcVar7->cmd_str).field_2 + 8);
      (pcVar7->cmd_str).field_2._M_allocated_capacity = 0;
      *(command_node **)((long)&(pcVar7->cmd_str).field_2 + 8) = (command_node *)0x0;
      pcVar8 = (command_node *)local_98;
      std::__cxx11::string::substr((ulong)pcVar8,(ulong)&local_58);
      pcVar8 = add_node(pcVar8,(command_node *)pcVar7,(string *)local_98,*(filter_t *)&pcVar7->ID,
                        *(bool *)&(pcVar7->cmd_str)._M_dataplus._M_p);
      if ((command_node *)local_98._0_8_ != (command_node *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      pcVar8->cmd = (command *)(pcVar7->cmd_str)._M_string_length;
      pcVar8->head = pcVar9;
      pcVar8->tail = pcVar14;
      pcVar8->start = (command_node *)(pcVar7->help)._M_string_length;
      *(ulong *)&pcVar7->ID = *(ulong *)&pcVar7->ID | (ulong)local_60;
      (pcVar7->cmd_str)._M_string_length = 0;
      *(bool *)&(pcVar7->cmd_str)._M_dataplus._M_p = SUB41(part.field_2._12_4_,0);
      (pcVar7->help)._M_string_length = 0;
      if ((size_type *)local_58._M_p != &part._M_string_length) {
        operator_delete(local_58._M_p,part._M_string_length + 1);
      }
    }
    else {
      debug::log(pdVar6,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      *(ulong *)&pcVar7->ID = *(ulong *)&pcVar7->ID | (ulong)local_60;
    }
  }
  return (command_node *)pcVar7;
}

Assistant:

command_node *command_node::add(const std::string &word, command::filter_t mask_, bool hidden_)
    {
        LC_LOG_VERBOSE("+word[%s] mask[0x%08x] hidden[%s]",word.c_str(),mask_,hidden_?"true":"false");

        mask |= mask_; // always update root mask

        if (head == NULL) {
            // no need to search; just add whole word
            LC_LOG_VERBOSE("add-new-root");
            return add_node(this,word,mask_,hidden_);
        }
        else {
            size_t ti = 0; // tree index (cumulative)
            size_t wi = 0; // index of first character in partial word (wi <= ti)
            size_t si = 0; // index into search word (0..length)

            command_node *root = this;
            command_node *prev = NULL;
            command_node *n = head;

            while (n != NULL && si < word.length()) {
                LC_LOG_VERBOSE("root[%p] prev[%p] n[%p] ti[%zu] wi[%zu] si[%zu]",root,prev,n,ti,wi,si);
                char c = word.at(si);
                size_t ri = (ti - wi); // index relative to partial dictionary word
                if (ri == 0) {
                    // check for match in first letter, else go to next command_node
                    if (n->part.at(ri) == c) {
                        ++si;
                        ++ti;
                    }
                    else if (n->next == NULL) {
                        return add_node(root,word.substr(si),mask_,hidden_);
                    }
                    else {
                        prev = n;
                        n = n->next;
                    }
                }
                else if (ri < n->part.length()) {
                    // check for match in current part
                    if (n->part.at(ri) == c) {
                        ++si;
                        ++ti;
                    }
                    else {
                        // mismatch = split + add new part
                        LC_LOG_VERBOSE("mismatch->split");
                        std::string part = n->part;
                        command_node *nn = new command_node;
                        nn->part.assign(part,0,ri);
                        nn->mask = n->mask | mask_;
                        nn->next = n->next;
                        n->part.assign(part.substr(ri));
                        n->next = NULL;
                        // split = move existing command_node down one level
                        add_node(nn,n);
                        if (prev == NULL) {
                            root->head = nn;
                        }
                        else {
                            prev->next = nn;
                        }
                        if (nn->next == NULL) {
                            root->tail = nn;
                        }
                        return add_node(nn,word.substr(si),mask_,hidden_);
                    }
                }
                else {
                    // reached end of current part; go down one level if possible
                    if (n->head == NULL) {
                        n->mask |= mask_;
                        return add_node(n,word.substr(si),mask_,hidden_);
                    }
                    else {
                        wi = ti;
                        root = n;
                        root->mask |= mask_;
                        prev = NULL;
                        n = n->head;
                    }
                }
            }

            LC_LOG_VERBOSE("END1: root[%p] prev[%p] n[%p] ti[%zu] si[%zu] word.length[%zu]",root,prev,n,ti,si,word.length());

            if (n == NULL) 
                n = root;

            LC_LOG_VERBOSE("END2: n[%p] wi[%zu] part.length[%zu]",n,wi,n->part.length());

            if (si < word.length()) {
                // not found --> add rest of word
                n->mask |= mask_;
                return add_node(n,word.substr(si),mask_,hidden_);
            }
            else if (si < (wi + n->part.length())) {
                // found, but only partially --> split + add new part
                LC_LOG_VERBOSE("found(partially)->split");
                size_t ri = (si - wi); // index relative to partial dictionary word
                std::string part = n->part;
                n->part.assign(part,0,ri);
                command_node *head__ = n->head;
                command_node *tail__ = n->tail;
                // move command node content to new node
                n->head = n->tail = NULL;
                command_node *nn = add_node(n,part.substr(ri),n->mask,n->hidden);
                nn->cmd = n->cmd;
                nn->head = head__;
                nn->tail = tail__;
                nn->start = n->start;
                // clean up current node
                n->mask |= mask_;
                n->cmd = NULL;
                n->hidden = hidden_;
                n->start = NULL;
            }
            else {
                // duplicate
                LC_LOG_VERBOSE("duplicate node");
                n->mask |= mask_;
            }

            return n;
        }
    }